

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.h
# Opt level: O0

void __thiscall Manager::Manager(Manager *this,int bRow,int bColumn,int Games)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  Board local_68;
  int local_30;
  int i;
  int local_1c;
  int local_18;
  int Games_local;
  int bColumn_local;
  int bRow_local;
  Manager *this_local;
  
  local_1c = Games;
  local_18 = bColumn;
  Games_local = bRow;
  _bColumn_local = this;
  std::vector<Board,_std::allocator<Board>_>::vector(&this->puzzles);
  std::vector<Board,_std::allocator<Board>_>::resize(&this->puzzles,(long)local_1c);
  local_30 = 0;
  while( true ) {
    uVar1 = (ulong)local_30;
    sVar2 = std::vector<Board,_std::allocator<Board>_>::size(&this->puzzles);
    if (sVar2 <= uVar1) break;
    Board::Board(&local_68,Games_local,local_18);
    this_00 = std::vector<Board,_std::allocator<Board>_>::operator[](&this->puzzles,(long)local_30);
    Board::operator=(this_00,&local_68);
    Board::~Board(&local_68);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

Manager( int bRow, int bColumn, int Games )
        {

            // "allocating" the vector of vectors using the method resize()
            puzzles.resize( Games );

           for( int i = 0; i < puzzles.size(); i++ )
           {
              puzzles[i] = Board( bRow, bColumn );
           }

        }